

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O3

void __thiscall CT::AllScans(CT *this)

{
  uint *puVar1;
  char cVar2;
  Mat1i *pMVar3;
  ulong uVar4;
  uint i_label;
  Mat1b *pMVar5;
  int iVar6;
  bool b_external;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  if (0 < *(int *)&pMVar5->field_0x8) {
    lVar10 = 0;
    do {
      uVar4 = (ulong)*(uint *)&pMVar5->field_0xc;
      if (0 < (int)*(uint *)&pMVar5->field_0xc) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar8 = **(long **)&pMVar3->field_0x48 * lVar10 + *(long *)&pMVar3->field_0x10;
        lVar9 = **(long **)&pMVar5->field_0x48 * lVar10 + *(long *)&pMVar5->field_0x10;
        lVar11 = 0;
        do {
          cVar2 = *(char *)(lVar9 + lVar11);
          if (cVar2 == (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
            i_label = *(uint *)(lVar8 + lVar11 * 4);
            iVar7 = (int)lVar11;
            if (i_label == 0) {
              if (lVar11 == 0) {
                i_label = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
                (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = i_label;
                iVar7 = 0;
              }
              else {
                if (*(char *)(lVar9 + -1 + lVar11) == cVar2) goto LAB_0018f5eb;
                i_label = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
                (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = i_label;
              }
              b_external = true;
            }
            else {
LAB_0018f5eb:
              if ((((int)uVar4 + -1 <= lVar11) || (*(char *)(lVar9 + 1 + lVar11) == cVar2)) ||
                 (*(int *)(lVar8 + 4 + lVar11 * 4) == -1)) {
                if (i_label == 0) {
                  *(undefined4 *)(lVar8 + lVar11 * 4) = *(undefined4 *)(lVar8 + -4 + lVar11 * 4);
                }
                goto LAB_0018f660;
              }
              if (i_label == 0) {
                i_label = *(uint *)(lVar8 + -4 + lVar11 * 4);
              }
              b_external = false;
            }
            ContourTracing(this,iVar7,(int)lVar10,i_label,b_external);
          }
LAB_0018f660:
          lVar11 = lVar11 + 1;
          pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
          uVar4 = (ulong)*(int *)&pMVar5->field_0xc;
        } while (lVar11 < (long)uVar4);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)&pMVar5->field_0x8);
  }
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar7 = *(int *)&pMVar3->field_0x8;
  if (0 < iVar7) {
    lVar10 = *(long *)&pMVar3->field_0x10;
    lVar8 = **(long **)&pMVar3->field_0x48;
    iVar6 = *(int *)&pMVar3->field_0xc;
    lVar9 = 0;
    do {
      if (0 < iVar6) {
        lVar11 = 0;
        do {
          if (*(int *)(lVar10 + lVar11 * 4) == -1) {
            *(undefined4 *)(lVar10 + lVar11 * 4) = 0;
            iVar6 = *(int *)&pMVar3->field_0xc;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar6);
        iVar7 = *(int *)&pMVar3->field_0x8;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + lVar8;
    } while (lVar9 < iVar7);
  }
  puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void AllScans()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        n_labels_ = 0;
        for (int y = 0; y < img_.rows; y++) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_out_row = img_labels_.ptr<unsigned int>(y);
            for (int x = 0; x < img_.cols; x++) {

                if (img_row[x] == byF) {
                    // Case 1
                    if (img_labels_out_row[x] == 0 && (x == 0 || img_row[x - 1] != byF)) {
                        n_labels_++;
                        ContourTracing(x, y, n_labels_, true);
                        continue;
                    }
                    // Case 2
                    else if (x < img_.cols - 1 && img_row[x + 1] != byF && img_labels_out_row[x + 1] != -1) {
                        if (img_labels_out_row[x] == 0) {
                            // Current pixel unlabeled
                            // Assing label of left pixel
                            ContourTracing(x, y, img_labels_out_row[x - 1], false);
                        }
                        else {
                            ContourTracing(x, y, img_labels_out_row[x], false);
                        }
                        continue;
                    }
                    // case 3
                    else if (img_labels_out_row[x] == 0) {
                        img_labels_out_row[x] = img_labels_out_row[x - 1];
                    }
                }
            }
        }

        // Reassign to contour background value (0)
        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            for (int c = 0; c < img_labels_.cols; ++c) {
                if (img_labels_row[c] == -1)
                    img_labels_row[c] = 0;
            }
        }

        n_labels_++; // To count also background label
    }